

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePolicyCommand.cxx
# Opt level: O1

bool cmCMakePolicyCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  PolicyStatus PVar5;
  cmState *this;
  cmValue cVar6;
  char *pcVar7;
  PolicyID id;
  size_t sVar8;
  cmMakefile *pcVar9;
  bool parent_scope;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string_view value;
  PolicyID pid;
  size_type __dnew;
  PolicyID local_dc;
  undefined1 local_d8 [32];
  _WordT local_b8;
  char *pcStack_b0;
  _WordT local_a8;
  pointer local_a0;
  undefined8 local_98;
  char *local_90;
  undefined8 local_88;
  char *local_80;
  undefined1 local_78 [48];
  string local_48;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar1 == (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    local_d8._0_8_ = local_d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,"requires at least one argument.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)pbVar1);
    if (iVar3 == 0) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x60) {
        iVar3 = std::__cxx11::string::compare((char *)(pbVar1 + 2));
        if (iVar3 == 0) {
          PVar5 = OLD;
        }
        else {
          iVar4 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 2));
          if (iVar4 != 0) {
            pbVar1 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            local_d8._24_8_ = pbVar1[2]._M_dataplus._M_p;
            local_d8._16_8_ = pbVar1[2]._M_string_length;
            local_d8._0_8_ = (char *)0x26;
            local_d8._8_8_ = "SET given unrecognized policy status \"";
            local_b8 = 1;
            pcStack_b0 = "\"";
            views._M_len = 3;
            views._M_array = (iterator)local_d8;
            cmCatViews_abi_cxx11_((string *)local_78,views);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            local_48._M_dataplus._M_p = (pointer)local_78._0_8_;
            if ((undefined1 *)local_78._0_8_ == local_78 + 0x10) {
              return false;
            }
            goto LAB_00254373;
          }
          PVar5 = NEW;
        }
        bVar2 = cmMakefile::SetPolicy
                          (status->Makefile,
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,PVar5);
        if (bVar2) {
          iVar4 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 1));
          bVar2 = true;
          if (iVar4 != 0 || iVar3 != 0) {
            return true;
          }
          this = cmMakefile::GetState(status->Makefile);
          pcVar7 = local_d8 + 0x10;
          local_d8._0_8_ = pcVar7;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d8,"CMAKE_BACKWARDS_COMPATIBILITY","");
          cVar6 = cmState::GetInitializedCacheValue(this,(string *)local_d8);
          if ((char *)local_d8._0_8_ != pcVar7) {
            operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
          }
          if (cVar6.Value != (string *)0x0) {
            return true;
          }
          pcVar9 = status->Makefile;
          local_d8._0_8_ = pcVar7;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d8,"CMAKE_BACKWARDS_COMPATIBILITY","");
          cmMakefile::AddCacheDefinition
                    (pcVar9,(string *)local_d8,"2.4",
                     "For backwards compatibility, what version of CMake commands and syntax should this version of CMake try to support."
                     ,STRING,false);
          local_78._16_8_ = local_d8._16_8_;
          local_78._0_8_ = local_d8._0_8_;
          if ((char *)local_d8._0_8_ == pcVar7) {
            return true;
          }
          goto LAB_00254537;
        }
        local_d8._0_8_ = local_d8 + 0x10;
        local_78._0_8_ = (char *)0x19;
        local_d8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_d8,(ulong)local_78);
        local_d8._16_8_ = local_78._0_8_;
        builtin_strncpy((char *)local_d8._0_8_,"SET failed to set policy.",0x19);
        local_d8._8_8_ = local_78._0_8_;
        *(char *)(local_d8._0_8_ + local_78._0_8_) = '\0';
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      else {
        local_d8._0_8_ = local_d8 + 0x10;
        local_78._0_8_ = (char *)0x31;
        local_d8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_d8,(ulong)local_78);
        local_d8._16_8_ = local_78._0_8_;
        builtin_strncpy((char *)local_d8._0_8_,"SET must be given exactly 2 additional arguments.",
                        0x31);
        local_d8._8_8_ = local_78._0_8_;
        *(char *)(local_d8._0_8_ + local_78._0_8_) = '\0';
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
    }
    else {
      iVar3 = std::__cxx11::string::compare
                        ((char *)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
      if (iVar3 == 0) {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (((long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x80) &&
           (iVar3 = std::__cxx11::string::compare((char *)(pbVar1 + 3)), iVar3 == 0)) {
          parent_scope = true;
        }
        else {
          if ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start != 0x60) {
            local_d8._0_8_ = local_d8 + 0x10;
            local_78._0_8_ = (char *)0x31;
            local_d8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_d8,(ulong)local_78);
            local_d8._16_8_ = local_78._0_8_;
            builtin_strncpy((char *)local_d8._0_8_,
                            "GET must be given exactly 2 additional arguments.",0x31);
            local_d8._8_8_ = local_78._0_8_;
            *(char *)(local_d8._0_8_ + local_78._0_8_) = '\0';
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_00254364;
          }
          parent_scope = false;
        }
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        bVar2 = cmPolicies::GetPolicyID(pbVar1[1]._M_dataplus._M_p,&local_dc);
        if (!bVar2) {
          local_d8._24_8_ = pbVar1[1]._M_dataplus._M_p;
          local_d8._16_8_ = pbVar1[1]._M_string_length;
          local_d8._0_8_ = (char *)0x12;
          local_d8._8_8_ = "GET given policy \"";
          local_b8 = 0x2e;
          pcStack_b0 = "\" which is not known to this version of CMake.";
          views_01._M_len = 3;
          views_01._M_array = (iterator)local_d8;
          cmCatViews_abi_cxx11_((string *)local_78,views_01);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          if ((undefined1 *)local_78._0_8_ == local_78 + 0x10) {
            return bVar2;
          }
LAB_00254537:
          operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
          return bVar2;
        }
        PVar5 = cmMakefile::GetPolicyStatus(status->Makefile,local_dc,parent_scope);
        if (REQUIRED_ALWAYS < PVar5) {
          return bVar2;
        }
        switch(PVar5) {
        case OLD:
          pcVar9 = status->Makefile;
          pcVar7 = "OLD";
          break;
        case WARN:
          pcVar9 = status->Makefile;
          pcVar7 = "";
          sVar8 = 0;
          goto LAB_00254587;
        case NEW:
          pcVar9 = status->Makefile;
          pcVar7 = "NEW";
          break;
        default:
          pcVar9 = status->Makefile;
          cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_48,(cmPolicies *)(ulong)local_dc,id);
          local_d8._0_8_ = local_48._M_string_length;
          local_d8._8_8_ = local_48._M_dataplus._M_p;
          local_d8._16_8_ = &DAT_00000001;
          local_d8._24_8_ =
               (long)
               ")\n  list(APPEND _cmake_expected_targets \"${_cmake_expected_target}\")\n  if(TARGET \"${_cmake_expected_target}\")\n    list(APPEND _cmake_targets_defined \"${_cmake_expected_target}\")\n  else()\n    list(APPEND _cmake_targets_not_defined \"${_cmake_expected_target}\")\n  endif()\nendforeach()\nunset(_cmake_expected_target)\nif(_cmake_targets_defined STREQUAL _cmake_expected_targets)\n  unset(_cmake_targets_defined)\n  unset(_cmake_targets_not_defined)\n  unset(_cmake_expected_targets)\n  unset(CMAKE_IMPORT_FILE_VERSION)\n  cmake_policy(POP)\n  return()\nendif()\nif(NOT _cmake_targets_defined STREQUAL \"\")\n  string(REPLACE \";\" \", \" _cmake_targets_defined_text \"${_cmake_targets_defined}\")\n  string(REPLACE \";\" \", \" _cmake_targets_not_defined_text \"${_cmake_targets_not_defined}\")\n  message(FATAL_ERROR \"Some (but not all) targets in this export set were already defined.\\nTargets Defined: ${_cmake_targets_defined_text}\\nTargets not yet defined: ${_cmake_targets_not_defined_text}\\n\")\nendif()\nunset(_cmake_targets_defined)\nunset(_cmake_targets_not_defined)\nunset(_cmake_expected_targets)\n\n\n"
               + 0x431;
          local_b8 = 0x1d;
          pcStack_b0 = "The call to cmake_policy(GET ";
          local_a0 = pbVar1[1]._M_dataplus._M_p;
          local_a8 = pbVar1[1]._M_string_length;
          local_98 = 0x51;
          local_90 = 
          " ...) at which this error appears requests the policy, and this version of CMake ";
          local_88 = 0x3c;
          local_80 = "requires that the policy be set to NEW before it is checked.";
          views_00._M_len = 6;
          views_00._M_array = (iterator)local_d8;
          cmCatViews_abi_cxx11_((string *)local_78,views_00);
          cmMakefile::IssueMessage(pcVar9,FATAL_ERROR,(string *)local_78);
          if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
            operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
          }
          local_78._16_8_ = local_48.field_2._M_allocated_capacity;
          local_78._0_8_ = local_48._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p == &local_48.field_2) {
            return bVar2;
          }
          goto LAB_00254537;
        }
        sVar8 = 3;
LAB_00254587:
        value._M_str = pcVar7;
        value._M_len = sVar8;
        cmMakefile::AddDefinition(pcVar9,pbVar1 + 2,value);
        return bVar2;
      }
      iVar3 = std::__cxx11::string::compare
                        ((char *)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
      if (iVar3 == 0) {
        if ((ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
          local_b8 = 0;
          pcStack_b0 = (char *)0x0;
          local_d8._16_8_ = 0;
          local_d8._24_8_ = 0;
          local_d8._0_8_ = (pointer)0x0;
          local_d8._8_8_ = (char *)0x0;
          local_a8 = 0;
          cmMakefile::PushPolicy(status->Makefile,false,(PolicyMap *)local_d8);
          return true;
        }
        local_d8._0_8_ = local_d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d8,"PUSH may not be given additional arguments.","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      else {
        iVar3 = std::__cxx11::string::compare
                          ((char *)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start);
        if (iVar3 != 0) {
          iVar3 = std::__cxx11::string::compare
                            ((char *)(args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start);
          if (iVar3 == 0) {
            bVar2 = anon_unknown.dwarf_804ac8::HandleVersionMode(args,status);
            return bVar2;
          }
          iVar3 = std::__cxx11::string::compare
                            ((char *)(args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start);
          if (iVar3 == 0) {
            bVar2 = anon_unknown.dwarf_804ac8::HandleGetWarningMode(args,status);
            return bVar2;
          }
          local_d8._0_8_ = &DAT_0000001e;
          local_d8._8_8_ = "given unknown first argument \"";
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_78._8_8_ = (pbVar1->_M_dataplus)._M_p;
          local_78._0_8_ = pbVar1->_M_string_length;
          cmStrCat<char[2]>(&local_48,(cmAlphaNum *)local_d8,(cmAlphaNum *)local_78,
                            (char (*) [2])0x6e9c70);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          local_78._16_8_ = local_48.field_2._M_allocated_capacity;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p == &local_48.field_2) {
            return false;
          }
          goto LAB_00254373;
        }
        if ((ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
          cmMakefile::PopPolicy(status->Makefile);
          return true;
        }
        local_d8._0_8_ = local_d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d8,"POP may not be given additional arguments.","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
    }
  }
LAB_00254364:
  local_78._16_8_ = local_d8._16_8_;
  local_48._M_dataplus._M_p = (pointer)local_d8._0_8_;
  if ((undefined1 *)local_d8._0_8_ == local_d8 + 0x10) {
    return false;
  }
LAB_00254373:
  operator_delete(local_48._M_dataplus._M_p,(ulong)(local_78._16_8_ + 1));
  return false;
}

Assistant:

bool cmCMakePolicyCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("requires at least one argument.");
    return false;
  }

  if (args[0] == "SET") {
    return HandleSetMode(args, status);
  }
  if (args[0] == "GET") {
    return HandleGetMode(args, status);
  }
  if (args[0] == "PUSH") {
    if (args.size() > 1) {
      status.SetError("PUSH may not be given additional arguments.");
      return false;
    }
    status.GetMakefile().PushPolicy();
    return true;
  }
  if (args[0] == "POP") {
    if (args.size() > 1) {
      status.SetError("POP may not be given additional arguments.");
      return false;
    }
    status.GetMakefile().PopPolicy();
    return true;
  }
  if (args[0] == "VERSION") {
    return HandleVersionMode(args, status);
  }
  if (args[0] == "GET_WARNING") {
    return HandleGetWarningMode(args, status);
  }

  status.SetError(cmStrCat("given unknown first argument \"", args[0], "\""));
  return false;
}